

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fVertexArrayTest.cpp
# Opt level: O2

int __thiscall
deqp::gles3::Functional::SingleVertexArrayStrideGroup::init
          (SingleVertexArrayStrideGroup *this,EVP_PKEY_CTX *ctx)

{
  Storage storage_;
  GLValue min_;
  GLValue max_;
  int iVar1;
  int iVar2;
  MultiVertexArrayTest *this_00;
  long lVar3;
  long lVar4;
  Storage extraout_EDX;
  Storage extraout_EDX_00;
  Storage storage;
  int t;
  InputType IVar5;
  long lVar6;
  bool bVar7;
  bool bVar8;
  GLValue GVar9;
  GLValue GVar10;
  Spec spec;
  undefined4 uStack_18c;
  undefined4 uStack_17c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  string name;
  string local_110;
  string local_f0;
  string local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  ArraySpec arraySpec;
  string local_50;
  
  lVar3 = 0;
  do {
    if (lVar3 == 2) {
      return 2;
    }
    for (t = 2; t != 5; t = t + 1) {
      for (lVar6 = 0; lVar6 != 2; lVar6 = lVar6 + 1) {
        for (lVar4 = 0; lVar4 != 0xc; lVar4 = lVar4 + 4) {
          IVar5 = this->m_type;
          if (lVar4 == 0) {
            iVar1 = 0x10;
            if ((IVar5 & ~INPUTTYPE_FIXED) != INPUTTYPE_UNSIGNED_INT_2_10_10_10) {
              iVar1 = deqp::gls::Array::inputTypeSize(IVar5);
              iVar1 = iVar1 * t;
              IVar5 = this->m_type;
              goto LAB_005a73b1;
            }
LAB_005a7391:
            iVar2 = deqp::gls::Array::inputTypeSize(IVar5);
            iVar2 = iVar2 * t;
            storage = extraout_EDX;
          }
          else {
            iVar1 = *(int *)((long)&DAT_009bcd50 + lVar4);
            if ((IVar5 & ~INPUTTYPE_FIXED) == INPUTTYPE_UNSIGNED_INT_2_10_10_10) goto LAB_005a7391;
LAB_005a73b1:
            iVar2 = deqp::gls::Array::inputTypeSize(IVar5);
            storage = extraout_EDX_00;
          }
          if (lVar3 == 1) {
            storage = iVar1 % iVar2;
            bVar7 = storage != STORAGE_USER;
          }
          else {
            bVar7 = false;
          }
          storage_ = UniformCase::randomFeatures(unsigned_int)::arrayUsageChoices[lVar3];
          deqp::gls::Array::storageToString_abi_cxx11_(&local_d0,(Array *)(ulong)storage_,storage);
          std::operator+(&local_170,&local_d0,"_stride");
          typeToString<int>(&local_f0,iVar1);
          std::operator+(&local_b0,&local_170,&local_f0);
          std::operator+(&local_150,&local_b0,"_components");
          typeToString<int>(&local_110,t);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&spec,
                         &local_150,&local_110);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &arraySpec,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&spec,
                         "_quads");
          iVar2 = (&DAT_009bd238)[lVar6];
          typeToString<int>(&local_50,iVar2);
          std::operator+(&name,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &arraySpec,&local_50);
          std::__cxx11::string::~string((string *)&local_50);
          std::__cxx11::string::~string((string *)&arraySpec);
          std::__cxx11::string::~string((string *)&spec);
          std::__cxx11::string::~string((string *)&local_110);
          std::__cxx11::string::~string((string *)&local_150);
          std::__cxx11::string::~string((string *)&local_b0);
          std::__cxx11::string::~string((string *)&local_f0);
          std::__cxx11::string::~string((string *)&local_170);
          std::__cxx11::string::~string((string *)&local_d0);
          IVar5 = this->m_type;
          if (IVar5 == INPUTTYPE_UNSIGNED_INT_2_10_10_10) {
            bVar8 = t == 4;
          }
          else {
            bVar8 = t == 4 || IVar5 != INPUTTYPE_INT_2_10_10_10;
          }
          if (bVar8) {
            GVar9 = deqp::gls::GLValue::getMinValue(IVar5);
            GVar10 = deqp::gls::GLValue::getMaxValue(this->m_type);
            max_._4_4_ = uStack_18c;
            max_.type = GVar10.type;
            min_._4_4_ = uStack_17c;
            min_.type = GVar9.type;
            min_.field_1 = GVar9.field_1;
            max_.field_1 = GVar10.field_1;
            deqp::gls::MultiVertexArrayTest::Spec::ArraySpec::ArraySpec
                      (&arraySpec,IVar5,OUTPUTTYPE_VEC4,storage_,USAGE_DYNAMIC_DRAW,t,0,iVar1,false,
                       min_,max_);
            spec.arrays.
            super__Vector_base<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,_std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            spec.arrays.
            super__Vector_base<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,_std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            spec.arrays.
            super__Vector_base<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,_std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            spec.primitive = PRIMITIVE_TRIANGLES;
            spec.first = 0;
            spec.drawCount = iVar2;
            std::
            vector<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,_std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>_>
            ::push_back(&spec.arrays,&arraySpec);
            if (!bVar7) {
              this_00 = (MultiVertexArrayTest *)operator_new(0xe0);
              deqp::gls::MultiVertexArrayTest::MultiVertexArrayTest
                        (this_00,(this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.
                                 m_testCtx,((this->super_TestCaseGroup).m_context)->m_renderCtx,
                         &spec,name._M_dataplus._M_p,name._M_dataplus._M_p);
              tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_00);
            }
            std::
            _Vector_base<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,_std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>_>
            ::~_Vector_base(&spec.arrays.
                             super__Vector_base<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,_std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>_>
                           );
          }
          std::__cxx11::string::~string((string *)&name);
        }
      }
    }
    lVar3 = lVar3 + 1;
  } while( true );
}

Assistant:

void SingleVertexArrayStrideGroup::init (void)
{
	Array::Storage		storages[]		= {Array::STORAGE_USER, Array::STORAGE_BUFFER};
	int					counts[]		= {1, 256};
	int					strides[]		= {/*0,*/ -1, 17, 32}; // Tread negative value as sizeof input. Same as 0, but done outside of GL.

	for (int storageNdx = 0; storageNdx < DE_LENGTH_OF_ARRAY(storages); storageNdx++)
	{
		for (int componentCount = 2; componentCount < 5; componentCount++)
		{
			for (int countNdx = 0; countNdx < DE_LENGTH_OF_ARRAY(counts); countNdx++)
			{
				for (int strideNdx = 0; strideNdx < DE_LENGTH_OF_ARRAY(strides); strideNdx++)
				{
					const bool	packed			= m_type == Array::INPUTTYPE_UNSIGNED_INT_2_10_10_10 || m_type == Array::INPUTTYPE_INT_2_10_10_10;
					const int	stride			= (strides[strideNdx] < 0) ? ((packed) ? (16) : (Array::inputTypeSize(m_type) * componentCount)) : (strides[strideNdx]);
					const int	alignment		= (packed) ? (Array::inputTypeSize(m_type) * componentCount) : (Array::inputTypeSize(m_type));
					const bool	bufferUnaligned	= (storages[storageNdx] == Array::STORAGE_BUFFER) && (stride % alignment) != 0;

					std::string name = Array::storageToString(storages[storageNdx]) + "_stride" + typeToString(stride) + "_components" + typeToString(componentCount) + "_quads" + typeToString(counts[countNdx]);

					if((m_type == Array::INPUTTYPE_UNSIGNED_INT_2_10_10_10 || m_type == Array::INPUTTYPE_INT_2_10_10_10) && componentCount != 4)
						continue;

					MultiVertexArrayTest::Spec::ArraySpec arraySpec(m_type,
																	Array::OUTPUTTYPE_VEC4,
																	storages[storageNdx],
																	Array::USAGE_DYNAMIC_DRAW,
																	componentCount,
																	0,
																	stride,
																	false,
																	GLValue::getMinValue(m_type),
																	GLValue::getMaxValue(m_type));

					MultiVertexArrayTest::Spec spec;
					spec.primitive	= Array::PRIMITIVE_TRIANGLES;
					spec.drawCount	= counts[countNdx];
					spec.first		= 0;
					spec.arrays.push_back(arraySpec);

					if (!bufferUnaligned)
						addChild(new MultiVertexArrayTest(m_testCtx, m_context.getRenderContext(), spec, name.c_str(), name.c_str()));
				}
			}
		}
	}
}